

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

int tcache_flush_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                    size_t newlen)

{
  long in_RCX;
  long in_R8;
  tsd_t *in_R9;
  uint tcache_ind;
  int ret;
  int local_38;
  uint in_stack_ffffffffffffffcc;
  int iVar1;
  
  if ((in_RCX == 0) && (in_R8 == 0)) {
    local_38 = -1;
    if (in_R9 != (tsd_t *)0x0) {
      if (newp != (void *)0x4) {
        return 0x16;
      }
      local_38._0_1_ = in_R9->state;
      local_38._1_1_ = in_R9->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled;
      local_38._2_1_ =
           in_R9->cant_access_tsd_items_directly_use_a_getter_or_setter_arenas_tdata_bypass;
      local_38._3_1_ = in_R9->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level
      ;
    }
    if (local_38 == -1) {
      iVar1 = 0xe;
    }
    else {
      tcaches_flush(in_R9,in_stack_ffffffffffffffcc);
      iVar1 = 0;
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int
tcache_flush_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	unsigned tcache_ind;

	WRITEONLY();
	tcache_ind = UINT_MAX;
	WRITE(tcache_ind, unsigned);
	if (tcache_ind == UINT_MAX) {
		ret = EFAULT;
		goto label_return;
	}
	tcaches_flush(tsd, tcache_ind);

	ret = 0;
label_return:
	return ret;
}